

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O1

bool PolledFile::Impl::readFileContents
               (char *filename,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_buffer)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  __off_t __nbytes;
  int __fd;
  int iVar4;
  uint *puVar5;
  size_type sVar6;
  bool bVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  stat st;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  stat local_b0;
  
  __fd = open(filename,0);
  if (__fd < 0) {
    bVar7 = false;
    aAppDebugPrintf("Cannot open file %s",filename);
  }
  else {
    iVar4 = stat(filename,&local_b0);
    __nbytes = local_b0.st_size;
    if (iVar4 == 0) {
      local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,local_b0.st_size)
      ;
      sVar6 = read(__fd,local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,__nbytes);
      if (sVar6 != __nbytes) {
        aAppDebugPrintf("Cannot read %d bytes from file \'%s\'",__nbytes & 0xffffffff,filename);
        local_b0.st_size = 0;
      }
      close(__fd);
      puVar1 = (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (out_buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      bVar7 = local_b0.st_size != 0;
      if (puVar1 != (pointer)0x0) {
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puVar1;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar3;
        operator_delete(puVar1,(long)puVar3 - (long)puVar1);
      }
    }
    else {
      puVar5 = (uint *)__errno_location();
      bVar7 = false;
      aAppDebugPrintf("Cannot read %s stat: errno=%d",filename,(ulong)*puVar5);
    }
  }
  return bVar7;
}

Assistant:

static bool readFileContents(const char *filename, std::vector<unsigned char>& out_buffer) {
#ifdef _WIN32
		const HANDLE fh = CreateFileA(filename, GENERIC_READ, FILE_SHARE_READ, NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
		if (fh == INVALID_HANDLE_VALUE) {
			MSG("Cannot open file '%s'", filename);
			return false;
		}

		LARGE_INTEGER splurge_integer;
		if (!GetFileSizeEx(fh, &splurge_integer) || splurge_integer.QuadPart > 1024 * 1024) {
			MSG("Cannot get file '%s' size or size is too large", filename);
			return false;
		}

		const size_t size = splurge_integer.QuadPart;
		std::vector<unsigned char> buffer;
		buffer.resize(size);
		DWORD bytes_read = 0;
		if (!ReadFile(fh, buffer.data(), size, &bytes_read, NULL) || bytes_read != size) {
			MSG("Cannot read %d bytes from file '%s'", size, filename);
			bytes_read = 0;
		}

		CloseHandle(fh);
		out_buffer.swap(buffer);
		return bytes_read != 0;
#else
		const int fd = open(filename, O_RDONLY);
		if (fd < 0) {
			MSG("Cannot open file %s", filename);
			return false;
		}

		struct stat st;
		const int result = stat(filename, &st);
		if (result != 0) {
			MSG("Cannot read %s stat: errno=%d", filename, errno);
			return false;
		}

		std::vector<unsigned char> buffer;
		buffer.resize(st.st_size);
		if (read(fd, buffer.data(), st.st_size) != st.st_size) {
			MSG("Cannot read %d bytes from file '%s'", (int)st.st_size, filename);
			st.st_size = 0;
		}

		close(fd);
		out_buffer.swap(buffer);
		return st.st_size != 0;
#endif
	}